

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfword_data_transfer.c
# Opt level: O0

void halfword_dt_io(arm7tdmi_t *state,arminstr_t *arminstr)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  sbyte sVar10;
  uint uVar11;
  uint uVar12;
  uint *in_RSI;
  undefined8 *in_RDI;
  uint8_t offset;
  halfword_dt_io_t instr;
  uint32_t value_3;
  uint32_t value_2;
  uint16_t value_1;
  uint32_t addr;
  uint32_t value_4;
  uint32_t value;
  int in_stack_fffffffffffffde8;
  uint32_t in_stack_fffffffffffffdec;
  uint in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  uint local_158;
  uint local_14c;
  byte local_13b;
  undefined4 local_130;
  uint local_120;
  uint local_3c;
  undefined4 local_2c;
  uint local_1c;
  undefined4 local_c;
  
  uVar11 = *in_RSI;
  uVar4 = uVar11 >> 0x17;
  local_13b = (byte)(uVar11 >> 0x15) & 1;
  uVar5 = uVar11 >> 0x14;
  bVar1 = (byte)(uVar11 >> 0x10) & 0xf;
  bVar2 = (byte)(uVar11 >> 0xc) & 0xf;
  uVar6 = uVar11 >> 6;
  uVar7 = uVar11 >> 5;
  uVar12 = (uint)(byte)((byte)uVar11 & 0xf | (byte)((uVar11 >> 8 & 0xf) << 4));
  if (((uVar11 & 0x1000000) == 0) && ((uVar11 >> 0x15 & 1) != 0)) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/halfword_data_transfer.c"
            ,10);
    fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
            "When p is 0, this bit must also always be 0!");
    exit(1);
  }
  if ((uVar11 & 0x1000000) == 0) {
    local_13b = 1;
  }
  if (((uVar6 & 1) == 0) && ((uVar7 & 1) == 0)) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/halfword_data_transfer.c"
            ,0xc);
    fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
            "This is actually a SWP instruction, something went wrong and execution shouldn\'t be here"
           );
    exit(1);
  }
  uVar8 = (uint)bVar1;
  if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar8)) && (uVar8 < 0xd)) {
    local_120 = *(uint *)((long)in_RDI + (ulong)(uVar8 - 8) * 4 + 0x6c);
  }
  else if (uVar8 < 0xd) {
    local_120 = *(uint *)((long)in_RDI + (ulong)uVar8 * 4 + 0x38);
  }
  else if (uVar8 == 0xd) {
    switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_3c = *(uint *)((long)in_RDI + 0x84);
      break;
    case 0x12:
      local_3c = *(uint *)(in_RDI + 0x12);
      break;
    case 0x13:
      local_3c = *(uint *)(in_RDI + 0x11);
      break;
    default:
      local_3c = *(uint *)(in_RDI + 0x10);
      break;
    case 0x17:
      local_3c = *(uint *)((long)in_RDI + 0x8c);
      break;
    case 0x1b:
      local_3c = *(uint *)((long)in_RDI + 0x94);
    }
    local_120 = local_3c;
  }
  else if (uVar8 == 0xe) {
    switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_1c = *(uint *)((long)in_RDI + 0x9c);
      break;
    case 0x12:
      local_1c = *(uint *)(in_RDI + 0x15);
      break;
    case 0x13:
      local_1c = *(uint *)(in_RDI + 0x14);
      break;
    default:
      local_1c = *(uint *)(in_RDI + 0x13);
      break;
    case 0x17:
      local_1c = *(uint *)((long)in_RDI + 0xa4);
      break;
    case 0x1b:
      local_1c = *(uint *)((long)in_RDI + 0xac);
    }
    local_120 = local_1c;
  }
  else {
    if (uVar8 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar8);
      exit(1);
    }
    local_120 = *(uint *)(in_RDI + 0x16);
  }
  local_14c = local_120;
  if ((uVar11 & 0x1000000) != 0) {
    local_14c = uVar12;
    if ((uVar4 & 1) == 0) {
      local_14c = -uVar12;
    }
    local_14c = local_14c + local_120;
  }
  if ((uVar5 & 1) == 0) {
    if (2 < gba_log_verbosity) {
      in_stack_fffffffffffffdf0 = uVar12;
      printf("[DEBUG] p: %d, u: %d, w: %d, l: %d, rn: %d, rd: %d, offset: %d, s: %d, h: %d\n",
             (ulong)((byte)(uVar11 >> 0x18) & 1),(ulong)((byte)uVar4 & 1),(ulong)local_13b,
             (ulong)((byte)uVar5 & 1),(ulong)bVar1,(uint)bVar2,uVar12,(uint)((byte)uVar6 & 1),
             (uint)((byte)uVar7 & 1));
    }
    if (((uVar6 & 1) == 0) && ((uVar7 & 1) != 0)) {
      if (bVar2 == 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/halfword_data_transfer.c"
                ,0x2d);
        fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","Special case for R15: PC");
        exit(1);
      }
      uVar6 = (uint)bVar2;
      if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar6)) && (uVar6 < 0xd)) {
        local_130 = *(undefined4 *)((long)in_RDI + (ulong)(uVar6 - 8) * 4 + 0x6c);
      }
      else if (uVar6 < 0xd) {
        local_130 = *(undefined4 *)((long)in_RDI + (ulong)uVar6 * 4 + 0x38);
      }
      else if (uVar6 == 0xd) {
        switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
        case 0x11:
          local_2c = *(undefined4 *)((long)in_RDI + 0x84);
          break;
        case 0x12:
          local_2c = *(undefined4 *)(in_RDI + 0x12);
          break;
        case 0x13:
          local_2c = *(undefined4 *)(in_RDI + 0x11);
          break;
        default:
          local_2c = *(undefined4 *)(in_RDI + 0x10);
          break;
        case 0x17:
          local_2c = *(undefined4 *)((long)in_RDI + 0x8c);
          break;
        case 0x1b:
          local_2c = *(undefined4 *)((long)in_RDI + 0x94);
        }
        local_130 = local_2c;
      }
      else if (uVar6 == 0xe) {
        switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
        case 0x11:
          local_c = *(undefined4 *)((long)in_RDI + 0x9c);
          break;
        case 0x12:
          local_c = *(undefined4 *)(in_RDI + 0x15);
          break;
        case 0x13:
          local_c = *(undefined4 *)(in_RDI + 0x14);
          break;
        default:
          local_c = *(undefined4 *)(in_RDI + 0x13);
          break;
        case 0x17:
          local_c = *(undefined4 *)((long)in_RDI + 0xa4);
          break;
        case 0x1b:
          local_c = *(undefined4 *)((long)in_RDI + 0xac);
        }
        local_130 = local_c;
      }
      else {
        if (uVar6 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar6);
          exit(1);
        }
        local_130 = *(undefined4 *)(in_RDI + 0x16);
      }
      (*(code *)in_RDI[4])(local_14c,(short)local_130,2,local_130);
    }
    else {
      if (((uVar6 & 1) != 0) && ((uVar7 & 1) == 0)) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/halfword_data_transfer.c"
                ,0x30);
        fprintf(_stderr,"ldrd unimplemented (is this caught by LDR?)\n\x1b[0;m");
        exit(1);
      }
      if (((uVar6 & 1) != 0) && ((uVar7 & 1) != 0)) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/halfword_data_transfer.c"
                ,0x32);
        fprintf(_stderr,"strd unimplemented (is this caught by STR?)\n\x1b[0;m");
        exit(1);
      }
    }
  }
  else {
    if (((uVar6 & 1) == 0) && ((uVar7 & 1) != 0)) {
      uVar3 = (*(code *)in_RDI[1])(local_14c,2);
      uVar6 = (uint)bVar2;
      sVar10 = (sbyte)((local_14c & 1) << 3);
      uVar7 = (uint)(uVar3 >> sVar10) | (uint)uVar3 << (-sVar10 & 0x1fU);
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar6,(ulong)uVar7);
      }
      if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar6)) && (uVar6 < 0xd)) {
        *(uint *)((long)in_RDI + (ulong)(uVar6 - 8) * 4 + 0x6c) = uVar7;
      }
      else if (uVar6 < 0xd) {
        *(uint *)((long)in_RDI + (ulong)uVar6 * 4 + 0x38) = uVar7;
      }
      else if (uVar6 == 0xd) {
        switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
        case 0x11:
          *(uint *)((long)in_RDI + 0x84) = uVar7;
          break;
        case 0x12:
          *(uint *)(in_RDI + 0x12) = uVar7;
          break;
        case 0x13:
          *(uint *)(in_RDI + 0x11) = uVar7;
          break;
        default:
          *(uint *)(in_RDI + 0x10) = uVar7;
          break;
        case 0x17:
          *(uint *)((long)in_RDI + 0x8c) = uVar7;
          break;
        case 0x1b:
          *(uint *)((long)in_RDI + 0x94) = uVar7;
        }
      }
      else if (uVar6 == 0xe) {
        switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
        case 0x11:
          *(uint *)((long)in_RDI + 0x9c) = uVar7;
          break;
        case 0x12:
          *(uint *)(in_RDI + 0x15) = uVar7;
          break;
        case 0x13:
          *(uint *)(in_RDI + 0x14) = uVar7;
          break;
        default:
          *(uint *)(in_RDI + 0x13) = uVar7;
          break;
        case 0x17:
          *(uint *)((long)in_RDI + 0xa4) = uVar7;
          break;
        case 0x1b:
          *(uint *)((long)in_RDI + 0xac) = uVar7;
        }
      }
      else {
        if (uVar6 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                  ,0xeb);
          fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar6);
          exit(1);
        }
        if ((*(uint *)((long)in_RDI + 0xb4) >> 5 & 1) == 0) {
          set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffdec);
        }
        else {
          set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffdec);
        }
      }
    }
    else if (((uVar6 & 1) == 0) || ((uVar7 & 1) != 0)) {
      if (((uVar6 & 1) != 0) && ((uVar7 & 1) != 0)) {
        if ((local_14c & 1) == 0) {
          (*(code *)in_RDI[1])(local_14c,2);
          local_158 = sign_extend_word(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                                       in_stack_fffffffffffffde8);
        }
        else {
          (*(code *)*in_RDI)(local_14c,2);
          local_158 = sign_extend_word(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                                       in_stack_fffffffffffffde8);
        }
        uVar6 = (uint)bVar2;
        if (2 < gba_log_verbosity) {
          printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar6,(ulong)local_158);
        }
        if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar6)) && (uVar6 < 0xd)) {
          *(uint *)((long)in_RDI + (ulong)(uVar6 - 8) * 4 + 0x6c) = local_158;
        }
        else if (uVar6 < 0xd) {
          *(uint *)((long)in_RDI + (ulong)uVar6 * 4 + 0x38) = local_158;
        }
        else if (uVar6 == 0xd) {
          switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
          case 0x11:
            *(uint *)((long)in_RDI + 0x84) = local_158;
            break;
          case 0x12:
            *(uint *)(in_RDI + 0x12) = local_158;
            break;
          case 0x13:
            *(uint *)(in_RDI + 0x11) = local_158;
            break;
          default:
            *(uint *)(in_RDI + 0x10) = local_158;
            break;
          case 0x17:
            *(uint *)((long)in_RDI + 0x8c) = local_158;
            break;
          case 0x1b:
            *(uint *)((long)in_RDI + 0x94) = local_158;
          }
        }
        else if (uVar6 == 0xe) {
          switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
          case 0x11:
            *(uint *)((long)in_RDI + 0x9c) = local_158;
            break;
          case 0x12:
            *(uint *)(in_RDI + 0x15) = local_158;
            break;
          case 0x13:
            *(uint *)(in_RDI + 0x14) = local_158;
            break;
          default:
            *(uint *)(in_RDI + 0x13) = local_158;
            break;
          case 0x17:
            *(uint *)((long)in_RDI + 0xa4) = local_158;
            break;
          case 0x1b:
            *(uint *)((long)in_RDI + 0xac) = local_158;
          }
        }
        else {
          if (uVar6 != 0xf) {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                    ,0xeb);
            fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar6);
            exit(1);
          }
          if ((*(uint *)((long)in_RDI + 0xb4) >> 5 & 1) == 0) {
            set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   in_stack_fffffffffffffdec);
          }
          else {
            set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   in_stack_fffffffffffffdec);
          }
        }
      }
    }
    else {
      (*(code *)*in_RDI)(local_14c,2);
      uVar6 = (uint)bVar2;
      uVar9 = sign_extend_word(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,
                               in_stack_fffffffffffffde8);
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar6,(ulong)uVar9);
      }
      if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar6)) && (uVar6 < 0xd)) {
        *(uint32_t *)((long)in_RDI + (ulong)(uVar6 - 8) * 4 + 0x6c) = uVar9;
      }
      else if (uVar6 < 0xd) {
        *(uint32_t *)((long)in_RDI + (ulong)uVar6 * 4 + 0x38) = uVar9;
      }
      else if (uVar6 == 0xd) {
        switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
        case 0x11:
          *(uint32_t *)((long)in_RDI + 0x84) = uVar9;
          break;
        case 0x12:
          *(uint32_t *)(in_RDI + 0x12) = uVar9;
          break;
        case 0x13:
          *(uint32_t *)(in_RDI + 0x11) = uVar9;
          break;
        default:
          *(uint32_t *)(in_RDI + 0x10) = uVar9;
          break;
        case 0x17:
          *(uint32_t *)((long)in_RDI + 0x8c) = uVar9;
          break;
        case 0x1b:
          *(uint32_t *)((long)in_RDI + 0x94) = uVar9;
        }
      }
      else if (uVar6 == 0xe) {
        switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
        case 0x11:
          *(uint32_t *)((long)in_RDI + 0x9c) = uVar9;
          break;
        case 0x12:
          *(uint32_t *)(in_RDI + 0x15) = uVar9;
          break;
        case 0x13:
          *(uint32_t *)(in_RDI + 0x14) = uVar9;
          break;
        default:
          *(uint32_t *)(in_RDI + 0x13) = uVar9;
          break;
        case 0x17:
          *(uint32_t *)((long)in_RDI + 0xa4) = uVar9;
          break;
        case 0x1b:
          *(uint32_t *)((long)in_RDI + 0xac) = uVar9;
        }
      }
      else {
        if (uVar6 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                  ,0xeb);
          fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar6);
          exit(1);
        }
        if ((*(uint *)((long)in_RDI + 0xb4) >> 5 & 1) == 0) {
          set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffdec);
        }
        else {
          set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffdec);
        }
      }
    }
    (*(code *)in_RDI[6])(1);
  }
  if ((local_13b != 0) && (((uVar5 & 1) == 0 || (bVar2 != bVar1)))) {
    if ((uVar11 & 0x1000000) == 0) {
      if ((uVar4 & 1) == 0) {
        uVar12 = -uVar12;
      }
      local_14c = uVar12 + local_14c;
    }
    uVar11 = (uint)bVar1;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar11,(ulong)local_14c);
    }
    if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar11)) && (uVar11 < 0xd)) {
      *(uint *)((long)in_RDI + (ulong)(uVar11 - 8) * 4 + 0x6c) = local_14c;
    }
    else if (uVar11 < 0xd) {
      *(uint *)((long)in_RDI + (ulong)uVar11 * 4 + 0x38) = local_14c;
    }
    else if (uVar11 == 0xd) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)((long)in_RDI + 0x84) = local_14c;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x12) = local_14c;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x11) = local_14c;
        break;
      default:
        *(uint *)(in_RDI + 0x10) = local_14c;
        break;
      case 0x17:
        *(uint *)((long)in_RDI + 0x8c) = local_14c;
        break;
      case 0x1b:
        *(uint *)((long)in_RDI + 0x94) = local_14c;
      }
    }
    else if (uVar11 == 0xe) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)((long)in_RDI + 0x9c) = local_14c;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x15) = local_14c;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x14) = local_14c;
        break;
      default:
        *(uint *)(in_RDI + 0x13) = local_14c;
        break;
      case 0x17:
        *(uint *)((long)in_RDI + 0xa4) = local_14c;
        break;
      case 0x1b:
        *(uint *)((long)in_RDI + 0xac) = local_14c;
      }
    }
    else {
      if (uVar11 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar11);
        exit(1);
      }
      if ((*(uint *)((long)in_RDI + 0xb4) >> 5 & 1) == 0) {
        set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffdec);
      }
      else {
        set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffdec);
      }
    }
  }
  return;
}

Assistant:

void halfword_dt_io(arm7tdmi_t* state, arminstr_t* arminstr) {
    halfword_dt_io_t instr = arminstr->parsed.HALFWORD_DT_IO;
    byte offset = instr.offset_low | (instr.offset_high << 4u);
    halfword_dt(state, instr.p, instr.u, instr.w, instr.l, instr.rn, instr.rd, offset, instr.s, instr.h);
}